

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O3

int cpoly(double *OPR,double *OPI,int DEGREE,double *ZEROR,double *ZEROI)

{
  double dVar1;
  size_t sVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  double *pdVar13;
  int iVar14;
  int iVar15;
  int NN;
  double *pdVar16;
  double *pdVar17;
  double *CI;
  long lVar18;
  double *pdVar19;
  double *pdVar20;
  double *QPR;
  int iVar21;
  bool bVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double *pdVar34;
  undefined1 auVar35 [16];
  double *in_stack_fffffffffffffde8;
  double local_1d8;
  double pit;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double *local_190;
  long local_188;
  long local_180;
  double local_178;
  undefined8 uStack_170;
  int local_164;
  int local_160;
  int local_15c;
  double local_158;
  double ZR;
  double ZI;
  double *local_140;
  size_t local_138;
  double *local_130;
  double *local_128;
  ulong local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  double *local_100;
  undefined8 *local_f8;
  long local_f0;
  double *local_e8;
  double *local_e0;
  uint local_d4;
  undefined8 *local_d0;
  ulong local_c8;
  int N;
  double SR;
  double SI;
  double local_a8;
  double *local_a0;
  double *local_98;
  double *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_70;
  uint local_6c;
  int CONV;
  double prt;
  double local_58;
  double TR;
  double TI;
  double *local_40;
  ulong local_38;
  
  local_130 = ZEROI;
  local_128 = ZEROR;
  local_88 = OPI;
  local_6c = DEGREE;
  pdVar3 = (double *)malloc(800);
  pdVar4 = (double *)malloc(800);
  pdVar5 = (double *)malloc(800);
  local_40 = (double *)malloc(800);
  local_90 = (double *)malloc(800);
  TI = (double)malloc(800);
  local_a0 = (double *)malloc(800);
  local_98 = (double *)malloc(800);
  puVar6 = (undefined8 *)malloc(800);
  local_d0 = (undefined8 *)malloc(800);
  prt = macheps();
  QPR = local_90;
  if ((((*OPR != 0.0) || (NAN(*OPR))) || (*local_88 != 0.0)) || (NAN(*local_88))) {
    local_180 = (long)(int)local_6c;
    local_6c = local_6c + 1;
    pdVar13 = (double *)(ulong)local_6c;
    uVar9 = (ulong)local_6c;
    if ((OPR[local_180] == 0.0) && (!NAN(OPR[local_180]))) {
      iVar15 = 0;
      lVar18 = 0;
      while ((local_88[local_180 + lVar18] == 0.0 && (!NAN(local_88[local_180 + lVar18])))) {
        local_128[iVar15] = 0.0;
        local_130[iVar15] = 0.0;
        lVar10 = lVar18 + -1;
        lVar18 = lVar18 + -1;
        iVar15 = iVar15 + 1;
        if ((OPR[local_180 + lVar10] != 0.0) || (NAN(OPR[local_180 + lVar10]))) break;
      }
      uVar9 = (ulong)((int)lVar18 + local_6c);
    }
    pdVar34 = (double *)0x7fefffffffffffff;
    uVar23 = 0;
    uVar24 = 0;
    if (0 < (int)uVar9) {
      uVar7 = 0;
      do {
        dVar31 = OPR[uVar7];
        pdVar3[uVar7] = dVar31;
        dVar32 = local_88[uVar7];
        pdVar4[uVar7] = dVar32;
        dVar31 = ABS(dVar31);
        dVar32 = ABS(dVar32);
        if (dVar32 <= dVar31) {
          if (dVar31 <= dVar32) {
            dVar32 = dVar31 * 1.4142135623730951;
          }
          else {
            dVar32 = SQRT((dVar32 / dVar31) * (dVar32 / dVar31) + 1.0) * dVar31;
          }
        }
        else {
          dVar32 = SQRT((dVar31 / dVar32) * (dVar31 / dVar32) + 1.0) * dVar32;
        }
        puVar6[uVar7] = dVar32;
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar7);
      if (0 < (int)uVar9) {
        uVar25 = 0xffffffff;
        uVar26 = 0x7fefffff;
        uVar27 = 0;
        uVar28 = 0;
        uVar7 = 0;
        auVar30 = ZEXT816(0);
        do {
          dVar31 = (double)puVar6[uVar7];
          uVar23 = SUB84(dVar31,0);
          uVar24 = (undefined4)((ulong)dVar31 >> 0x20);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = dVar31;
          if (dVar31 == 0.0 || (double)CONCAT44(uVar26,uVar25) <= dVar31) {
            auVar35._4_4_ = uVar26;
            auVar35._0_4_ = uVar25;
            auVar35._12_4_ = uVar28;
            auVar35._8_4_ = uVar27;
          }
          pdVar34 = auVar35._0_8_;
          if (dVar31 <= auVar30._0_8_) {
            uVar23 = auVar30._0_4_;
            uVar24 = auVar30._4_4_;
          }
          uVar7 = uVar7 + 1;
          uVar25 = auVar35._0_4_;
          uVar26 = auVar35._4_4_;
          uVar27 = auVar35._8_4_;
          uVar28 = auVar35._12_4_;
          auVar30._4_4_ = uVar24;
          auVar30._0_4_ = uVar23;
          auVar30._8_8_ = 0;
        } while (uVar9 != uVar7);
      }
    }
    if (((double)pdVar34 < 2.2250738585072014e-308 / prt) ||
       (uVar7 = uVar9, 1.3407807929942596e+154 < (double)CONCAT44(uVar24,uVar23))) {
      dVar31 = (2.2250738585072014e-308 / prt) / (double)pdVar34;
      local_c8 = uVar9;
      local_120 = uVar9;
      if (dVar31 <= 1.0) {
        if ((double)CONCAT44(uVar24,uVar23) < 0.0) {
          local_88 = pdVar34;
          pdVar16 = (double *)sqrt((double)CONCAT44(uVar24,uVar23));
          pdVar34 = local_88;
        }
        else {
          pdVar16 = (double *)SQRT((double)CONCAT44(uVar24,uVar23));
        }
        if ((double)pdVar34 < 0.0) {
          local_88 = pdVar16;
          dVar31 = sqrt((double)pdVar34);
          pdVar16 = local_88;
        }
        else {
          dVar31 = SQRT((double)pdVar34);
        }
        dVar31 = 1.0 / ((double)pdVar16 * dVar31);
      }
      else if ((double)CONCAT44(uVar24,uVar23) <= 1.79769313486232e+308 / dVar31 &&
               1.79769313486232e+308 / dVar31 != (double)CONCAT44(uVar24,uVar23)) {
        dVar31 = 1.0;
      }
      dVar31 = log(dVar31);
      dVar31 = exp2(dVar31 / 0.6931471805599453 + 0.5);
      uVar9 = local_c8;
      uVar7 = local_120;
      if (((dVar31 != 1.0) || (NAN(dVar31))) && (0 < (int)local_120)) {
        uVar8 = 0;
        do {
          pdVar3[uVar8] = pdVar3[uVar8] * dVar31;
          pdVar4[uVar8] = pdVar4[uVar8] * dVar31;
          uVar8 = uVar8 + 1;
        } while (local_c8 != uVar8);
      }
    }
    iVar15 = (int)uVar7;
    if (iVar15 < 3) {
LAB_0012ab2c:
      _CONV = -pdVar3[1];
      local_1d8 = -pdVar4[1];
      CDIVID((double *)&CONV,&local_1d8,pdVar4,local_128 + local_180 + -1,*pdVar3,
             local_130 + local_180 + -1,pdVar13);
      iVar15 = 0;
      goto LAB_0012ab95;
    }
    local_1c0 = prt * 2.8284271247461903;
    dVar31 = prt * 10.0;
    local_d4 = iVar15 - 1;
    uVar7 = (ulong)local_d4;
    local_120 = (ulong)(iVar15 - 2);
    lVar18 = -uVar9;
    pdVar34 = local_40 + uVar9;
    pdVar16 = pdVar5 + uVar9;
    local_188 = uVar9 - 2;
    local_1a0 = -0.70710678;
    local_1a8 = 0.70710678;
    uVar8 = 0;
    local_c8 = uVar9;
    ZI = (double)pdVar3;
    local_140 = pdVar4;
    local_100 = pdVar5;
    local_f8 = puVar6;
LAB_00129e74:
    puVar6 = local_f8;
    local_138 = (uVar7 - uVar8) * 8;
    uVar9 = 0;
    do {
      dVar32 = ABS(pdVar3[uVar9]);
      dVar1 = ABS(pdVar4[uVar9]);
      if (dVar1 <= dVar32) {
        if (dVar32 <= dVar1) {
          dVar1 = dVar32 * 1.4142135623730951;
        }
        else {
          dVar1 = SQRT((dVar1 / dVar32) * (dVar1 / dVar32) + 1.0) * dVar32;
        }
      }
      else {
        dVar1 = SQRT((dVar32 / dVar1) * (dVar32 / dVar1) + 1.0) * dVar1;
      }
      local_f8[uVar9] = dVar1;
      uVar9 = uVar9 + 1;
    } while (local_c8 != uVar9);
    local_178 = (double)local_f8[local_c8 - 1];
    local_f8[local_c8 - 1] = -local_178;
    uStack_170 = 0;
    local_f0 = lVar18;
    local_e8 = pdVar34;
    local_e0 = pdVar16;
    local_38 = local_c8;
    local_c8 = local_c8 - 1;
    local_118 = log(local_178);
    local_88 = (double *)*puVar6;
    dVar32 = log((double)local_88);
    dVar1 = (double)(int)local_c8;
    local_198 = exp((local_118 - dVar32) / dVar1);
    dVar32 = (double)puVar6[local_38 - 2];
    if (((dVar32 != 0.0) || (NAN(dVar32))) && (local_178 / dVar32 < local_198)) {
      local_198 = local_178 / dVar32;
    }
    if (0.0 < (double)local_88) {
      uVar12 = 0;
      do {
        local_198 = local_198 * 0.1;
        uVar9 = 1;
        pdVar13 = local_88;
        do {
          pdVar13 = (double *)((double)pdVar13 * local_198 + (double)puVar6[uVar9]);
          uVar9 = uVar9 + 1;
        } while (local_38 != uVar9);
      } while ((0.0 < (double)pdVar13) && (bVar22 = uVar12 < 999, uVar12 = uVar12 + 1, bVar22));
    }
    if (0.005 < ABS(local_198 / local_198)) {
      uVar12 = 0;
      do {
        *local_d0 = local_88;
        uVar9 = 1;
        pdVar13 = local_88;
        do {
          pdVar13 = (double *)((double)pdVar13 * local_198 + (double)puVar6[uVar9]);
          local_d0[uVar9] = pdVar13;
          uVar9 = uVar9 + 1;
        } while (local_38 != uVar9);
        uVar9 = 2;
        pdVar13 = local_88;
        do {
          pdVar13 = (double *)((double)pdVar13 * local_198 + (double)local_d0[uVar9 - 1]);
          uVar9 = uVar9 + 1;
        } while (local_38 != uVar9);
        local_198 = local_198 - (double)local_d0[local_c8] / (double)pdVar13;
      } while ((0.005 < ABS(((double)local_d0[local_c8] / (double)pdVar13) / local_198)) &&
              (bVar22 = uVar12 < 999, uVar12 = uVar12 + 1, bVar22));
    }
    local_190 = local_40 + (local_38 - 2);
    dVar33 = ABS(pdVar3[local_38 - 2]);
    dVar32 = ABS(pdVar4[local_38 - 2]);
    local_1b8 = *pdVar3;
    local_1b0 = *pdVar4;
    pdVar34 = (double *)
              ((double)(~-(ulong)(dVar33 < dVar32) &
                        (ulong)((double)(~-(ulong)(dVar32 < dVar33) & 0x3ff6a09e667f3bcd |
                                        (ulong)SQRT((dVar32 / dVar33) * (dVar32 / dVar33) + 1.0) &
                                        -(ulong)(dVar32 < dVar33)) * dVar33) |
                       (ulong)(SQRT((dVar33 / dVar32) * (dVar33 / dVar32) + 1.0) * dVar32) &
                       -(ulong)(dVar33 < dVar32)) * dVar31);
    pdVar16 = (double *)0x0;
    iVar15 = 1;
    do {
      lVar18 = 1;
      uVar12 = local_d4;
      do {
        pdVar5[lVar18 + -1] = (pdVar3[lVar18 + -1] * (double)(int)uVar12) / dVar1;
        local_40[lVar18 + -1] = ((double)(int)uVar12 * pdVar4[lVar18 + -1]) / dVar1;
        lVar18 = lVar18 + 1;
        uVar12 = uVar12 - 1;
      } while (local_f0 + lVar18 != 0);
      iVar14 = 0;
      pdVar13 = local_190;
      uVar9 = local_38;
      lVar18 = local_f0;
      pdVar17 = local_e8;
      CI = local_40;
      pdVar19 = local_e0;
      pdVar20 = (double *)TI;
      dVar32 = local_198;
      local_15c = iVar15;
      do {
        dVar33 = ABS(pdVar5[uVar9 - 2]);
        dVar29 = ABS(*pdVar13);
        if (dVar29 <= dVar33) {
          if (dVar33 <= dVar29) {
            dVar29 = dVar33 * 1.4142135623730951;
          }
          else {
            dVar29 = SQRT((dVar29 / dVar33) * (dVar29 / dVar33) + 1.0) * dVar33;
          }
        }
        else {
          dVar29 = SQRT((dVar33 / dVar29) * (dVar33 / dVar29) + 1.0) * dVar29;
        }
        if (dVar29 <= (double)pdVar34) {
          lVar10 = -2;
          do {
            pdVar19[lVar10] = pdVar19[lVar10 + -1];
            pdVar17[lVar10] = pdVar17[lVar10 + -1];
            lVar10 = lVar10 + -1;
          } while (lVar18 != lVar10);
          uVar23 = 0;
          uVar24 = 0;
          uVar25 = 0;
          uVar26 = 0;
        }
        else {
          local_88 = (double *)*pdVar3;
          uStack_80 = 0;
          _CONV = -(double)local_88;
          local_118 = *pdVar4;
          uStack_110 = 0;
          local_1d8 = -local_118;
          CDIVID((double *)&CONV,&local_1d8,pdVar13,&local_58,pdVar5[uVar9 - 2],&TR,CI);
          lVar18 = local_188;
          do {
            dVar32 = local_40[lVar18 + -1];
            pdVar5[lVar18] = local_58 * pdVar5[lVar18 + -1] + dVar32 * -TR + pdVar3[lVar18];
            local_40[lVar18] = dVar32 * local_58 + pdVar5[lVar18 + -1] * TR + pdVar4[lVar18];
            lVar18 = lVar18 + -1;
          } while (lVar18 != 0);
          pdVar13 = local_190;
          uVar9 = local_38;
          lVar18 = local_f0;
          pdVar17 = local_e8;
          CI = local_40;
          pdVar19 = local_e0;
          pdVar20 = (double *)TI;
          uVar23 = (int)local_88;
          uVar24 = local_88._4_4_;
          uVar25 = (int)local_118;
          uVar26 = local_118._4_4_;
          dVar32 = local_198;
        }
        *pdVar5 = (double)CONCAT44(uVar24,uVar23);
        *CI = (double)CONCAT44(uVar26,uVar25);
        iVar14 = iVar14 + 1;
      } while (iVar14 != 5);
      iVar15 = 1;
      do {
        dVar33 = local_1a8 * -0.060756474 + local_1a0 * -0.99756405;
        local_1a0 = local_1a8 * 0.99756405 + local_1a0 * -0.060756474;
        pit = dVar32 * dVar33;
        local_1c8 = dVar32 * local_1a0;
        *QPR = local_1b8;
        *pdVar20 = local_1b0;
        uVar11 = 1;
        dVar32 = local_1b8;
        local_a8 = local_1b0;
        do {
          SI = (dVar32 * pit - local_1c8 * local_a8) + pdVar3[uVar11];
          local_a8 = local_a8 * pit + dVar32 * local_1c8 + pdVar4[uVar11];
          QPR[uVar11] = SI;
          pdVar20[uVar11] = local_a8;
          uVar11 = uVar11 + 1;
          dVar32 = SI;
        } while (uVar9 != uVar11);
        local_164 = iVar15 * 10;
        local_1a8 = dVar33;
        _N = pit;
        SR = local_1c8;
        CALCT(&CONV,(int)uVar9,(double *)&N,&SR,pdVar5,CI,local_a0,local_98,prt,
              1.79769313486232e+308,&SI,&local_a8,&local_58,&TR);
        local_160 = iVar15 * 10 + -1;
        local_178 = (double)CONCAT44(local_178._4_4_,1);
        iVar14 = 0;
        local_118 = (double)((ulong)local_118 & 0xffffffff00000000);
        do {
          pdVar13 = local_40;
          dVar33 = TR;
          dVar32 = local_58;
          pdVar5 = local_98;
          pdVar4 = local_a0;
          pdVar3 = local_100;
          local_88 = (double *)CONCAT44(local_88._4_4_,iVar14);
          iVar14 = (int)local_38;
          NEXTH((int *)((ulong)_CONV & 0xffffffff),iVar14,local_a0,local_98,QPR,(double *)TI,
                &local_58,&TR,local_100,local_40);
          CALCT(&CONV,iVar14,(double *)&N,&SR,pdVar3,pdVar13,pdVar4,pdVar5,prt,1.79769313486232e+308
                ,&SI,&local_a8,&local_58,&TR);
          QPR = local_90;
          pdVar3 = local_100;
          sVar2 = local_138;
          local_158 = pit + local_58;
          ZR = local_1c8 + TR;
          iVar21 = (int)local_118;
          iVar14 = (int)local_88;
          if (local_178._0_4_ != 0 && CONV != 1) {
            local_178 = (double)CONCAT44(local_178._4_4_,1);
            if ((int)local_88 != local_160) {
              dVar29 = ABS(local_58 - dVar32);
              dVar32 = ABS(TR - dVar33);
              if (dVar32 <= dVar29) {
                if (dVar29 <= dVar32) {
                  dVar32 = dVar29 * 1.4142135623730951;
                }
                else {
                  dVar32 = SQRT((dVar32 / dVar29) * (dVar32 / dVar29) + 1.0) * dVar29;
                }
              }
              else {
                dVar32 = SQRT((dVar29 / dVar32) * (dVar29 / dVar32) + 1.0) * dVar32;
              }
              dVar33 = ABS(local_158);
              dVar29 = ABS(ZR);
              if (dVar29 <= dVar33) {
                if (dVar33 <= dVar29) {
                  dVar29 = dVar33 * 1.4142135623730951;
                }
                else {
                  dVar29 = SQRT((dVar29 / dVar33) * (dVar29 / dVar33) + 1.0) * dVar33;
                }
              }
              else {
                dVar29 = SQRT((dVar33 / dVar29) * (dVar33 / dVar29) + 1.0) * dVar29;
              }
              iVar21 = 0;
              if (dVar32 < dVar29 * 0.5) {
                iVar21 = 1;
                if ((int)local_118 == 1) {
                  memcpy(local_f8,local_100,local_138);
                  pdVar4 = local_40;
                  memcpy(local_d0,local_40,sVar2);
                  iVar14 = (int)local_88;
                  VRSHFT((int)local_38,(int)&local_158,&ZR,(double *)&local_70,&N,&SR,(double *)ZI,
                         local_140,QPR,(double *)TI,&SI,&local_a8,pdVar3,prt,local_1c0,prt,
                         1.79769313486232e+308,pdVar4,local_a0,local_98,&local_58,&TR,pdVar34,
                         pdVar16,in_stack_fffffffffffffde8);
                  pdVar3 = local_100;
                  sVar2 = local_138;
                  NN = (int)local_38;
                  if (local_70 == 1) break;
                  memcpy(local_100,local_f8,local_138);
                  memcpy(local_40,local_d0,sVar2);
                  _N = pit;
                  SR = local_1c8;
                  *QPR = local_1b8;
                  *(double *)TI = local_1b0;
                  uVar9 = 1;
                  dVar32 = local_1b8;
                  local_a8 = local_1b0;
                  do {
                    SI = (dVar32 * pit - local_1c8 * local_a8) + *(double *)((long)ZI + uVar9 * 8);
                    local_a8 = local_a8 * pit + dVar32 * local_1c8 + local_140[uVar9];
                    QPR[uVar9] = SI;
                    *(double *)((long)TI + uVar9 * 8) = local_a8;
                    uVar9 = uVar9 + 1;
                    dVar32 = SI;
                  } while (local_38 != uVar9);
                  CALCT(&CONV,(int)local_38,(double *)&N,&SR,pdVar3,local_40,local_a0,local_98,prt,
                        1.79769313486232e+308,&SI,&local_a8,&local_58,&TR);
                  local_178 = (double)((ulong)local_178 & 0xffffffff00000000);
                }
                else {
                  local_178 = (double)CONCAT44(local_178._4_4_,1);
                }
              }
            }
          }
          NN = (int)local_38;
          iVar14 = iVar14 + 1;
          local_118 = (double)CONCAT44(local_118._4_4_,iVar21);
        } while (iVar14 != local_164);
        pdVar5 = local_100;
        pdVar4 = local_140;
        pdVar3 = (double *)ZI;
        pdVar13 = &SR;
        VRSHFT(NN,(int)&local_158,&ZR,(double *)&local_70,&N,pdVar13,(double *)ZI,local_140,QPR,
               (double *)TI,&SI,&local_a8,local_100,prt,local_1c0,prt,1.79769313486232e+308,local_40
               ,local_a0,local_98,&local_58,&TR,pdVar34,pdVar16,in_stack_fffffffffffffde8);
        sVar2 = local_138;
        if (local_70 == 1) {
          local_128[(int)(local_6c - (int)local_38)] = local_158;
          local_130[(int)(local_6c - (int)local_38)] = ZR;
          memcpy(pdVar3,QPR,local_138);
          memcpy(pdVar4,(void *)TI,sVar2);
          uVar8 = uVar8 + 1;
          lVar18 = local_f0 + 1;
          local_d4 = local_d4 - 1;
          pdVar34 = local_e8 + -1;
          pdVar16 = local_e0 + -1;
          local_188 = local_188 + -1;
          puVar6 = local_f8;
          if (uVar8 != local_120) goto LAB_00129e74;
          goto LAB_0012ab2c;
        }
        iVar15 = iVar15 + 1;
        uVar9 = local_38;
        CI = local_40;
        pdVar20 = (double *)TI;
        dVar32 = local_198;
      } while (iVar15 != 10);
      iVar15 = local_15c + 1;
      puVar6 = local_f8;
    } while (iVar15 != 3);
  }
  iVar15 = 1;
LAB_0012ab95:
  free(pdVar3);
  free(pdVar4);
  free(pdVar5);
  free(local_40);
  free(local_90);
  free((void *)TI);
  free(local_a0);
  free(local_98);
  free(puVar6);
  free(local_d0);
  return iVar15;
}

Assistant:

int cpoly(double *OPR, double *OPI, int DEGREE, double *ZEROR, double *ZEROI) {
	/* FINDS THE ZEROS OF A COMPLEX POLYNOMIAL.
	C OPR, OPI  -  DOUBLE PRECISION VECTORS OF REAL AND
	C IMAGINARY PARTS OF THE COEFFICIENTS IN
	C ORDER OF DECREASING POWERS.
	C DEGREE    -  INTEGER DEGREE OF POLYNOMIAL.
	C ZEROR, ZEROI  -  OUTPUT DOUBLE PRECISION VECTORS OF
	C REAL AND IMAGINARY PARTS OF THE ZEROS.
	C FAIL      -  OUTPUT LOGICAL PARAMETER,  TRUE  ONLY IF
	C LEADING COEFFICIENT IS ZERO OR IF CPOLY
	C HAS FOUND FEWER THAN DEGREE ZEROS.
	C THE PROGRAM HAS BEEN WRITTEN TO REDUCE THE CHANCE OF OVERFLOW
	C OCCURRING. IF IT DOES OCCUR, THERE IS STILL A POSSIBILITY THAT
	C THE ZEROFINDER WILL WORK PROVIDED THE OVERFLOWED QUANTITY IS
	C REPLACED BY A LARGE NUMBER.*/
	int fail,CONV;
	double *PR, *PI, *HR, *HI, *QPR, *QPI, *QHR, *QHI, *SHR, *SHI;
	double SR, SI, TR, TI, PVR, PVI, ARE, MRE, ETA, INFIN;
	double XX, YY, COSR, SINR, SMALNO, BASE, XXX, ZR, ZI, BND;
	int NN,CNT1,CNT2,IDNN2,i;
	double prt, pit;

	PR = (double*)malloc(sizeof(double)* 100);
	PI = (double*)malloc(sizeof(double)* 100);
	HR = (double*)malloc(sizeof(double)* 100);
	HI = (double*)malloc(sizeof(double)* 100);
	QPR = (double*)malloc(sizeof(double)* 100);
	QPI = (double*)malloc(sizeof(double)* 100);
	QHR = (double*)malloc(sizeof(double)* 100);
	QHI = (double*)malloc(sizeof(double)* 100);
	SHR = (double*)malloc(sizeof(double)* 100);
	SHI = (double*)malloc(sizeof(double)* 100);

	mcon(&ETA, &INFIN, &SMALNO, &BASE);

	ARE = ETA;
	MRE = 2.0*sqrt(2.0)*ETA;
	XX = .70710678;
	YY = -XX;
	COSR = -.060756474;
	SINR = .99756405;
	fail = 0;
	NN = DEGREE + 1;

	if (!(OPR[0] != 0.0 || OPI[0] != 0.0)) {
		fail = 1;
		free(PR);
		free(PI);
		free(HR);
		free(HI);
		free(QPR);
		free(QPI);
		free(QHR);
		free(QHI);
		free(SHR);
		free(SHI);
		return fail;
	}

	while (!(OPR[NN - 1] != 0.0 || OPI[NN - 1] != 0.0)) {
		IDNN2 = DEGREE - NN + 2;
		ZEROR[IDNN2 - 1] = 0.0;
		ZEROI[IDNN2 - 1] = 0.0;
		NN = NN - 1;
	}

	for (i = 0; i < NN; ++i) {
		PR[i] = OPR[i];
		PI[i] = OPI[i];
		SHR[i] = CMOD(&PR[i], &PI[i]);
	}

	BND = RESCALE(NN, SHR, ETA, INFIN, SMALNO, BASE);

	if (BND != 1.0) {
		for (i = 0; i < NN; ++i) {
			PR[i] = BND*PR[i];
			PI[i] = BND*PI[i];
		}
	}

	NNITER: if (NN <= 2) {
				prt = -1.0 * PR[1];
				pit = -1.0 * PI[1];
				CDIVID(&prt, &pit, &PR[0], &PI[0], INFIN, &ZEROR[DEGREE - 1], &ZEROI[DEGREE - 1]);
				free(PR);
				free(PI);
				free(HR);
				free(HI);
				free(QPR);
				free(QPI);
				free(QHR);
				free(QHI);
				free(SHR);
				free(SHI);
				return fail;
			}

	for (i = 0; i < NN; ++i) {
		SHR[i] = CMOD(&PR[i], &PI[i]);
	}

	BND = CAUCHY(NN, SHR, SHI);

	/*
	C OUTER LOOP TO CONTROL 2 MAJOR PASSES WITH DIFFERENT SEQUENCES
	C OF SHIFTS.
	*/

	for (CNT1 = 1; CNT1 <= 2; ++CNT1) {
		//C FIRST STAGE CALCULATION, NO SHIFT.
		NOSHFT(NN, 5, &SR, &SI, PR, PI, QPR, QPI, &PVR, &PVI, ARE, MRE, ETA, INFIN, HR, HI, QHR, QHI, SHR, SHI, &TR, &TI);
		//C INNER LOOP TO SELECT A SHIFT.
		for (CNT2 = 1; CNT2 <= 9; ++CNT2) {
			//C SHIFT IS CHOSEN WITH MODULUS BND AND AMPLITUDE ROTATED BY
			//C 94 DEGREES FROM THE PREVIOUS SHIFT
			XXX = COSR*XX - SINR*YY;
			YY = SINR*XX + COSR*YY;
			XX = XXX;
			SR = BND*XX;
			SI = BND*YY;
			//C SECOND STAGE CALCULATION, FIXED SHIFT.
			FXSHFT(NN, 10*CNT2, &ZR, &ZI, &CONV, &SR, &SI, PR, PI, QPR, QPI, &PVR, &PVI, ARE, MRE, ETA, INFIN, HR, HI, QHR, QHI, SHR, SHI, &TR, &TI);
			if (CONV == 1) {
				//C THE SECOND STAGE JUMPS DIRECTLY TO THE THIRD STAGE ITERATION.
				//C IF SUCCESSFUL THE ZERO IS STORED AND THE POLYNOMIAL DEFLATED.
				IDNN2 = DEGREE - NN + 2;
				ZEROR[IDNN2 - 1] = ZR;
				ZEROI[IDNN2 - 1] = ZI;
				NN = NN - 1;
				for (i = 0; i < NN; ++i) {
					PR[i] = QPR[i];
					PI[i] = QPI[i];
				}
				goto NNITER;
			}//80
		}
	}

	fail = 1;

	free(PR);
	free(PI);
	free(HR);
	free(HI);
	free(QPR);
	free(QPI);
	free(QHR);
	free(QHI);
	free(SHR);
	free(SHI);
	return fail;
}